

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

size_t (anonymous_namespace)::miniz::mz_zip_file_read_func
                 (void *pOpaque,mz_uint64 file_ofs,void *pBuf,size_t n)

{
  int iVar1;
  mz_uint64 mVar2;
  size_t sVar3;
  
  mVar2 = ftello64(*(FILE **)(*(long *)((long)pOpaque + 0x58) + 0x60));
  if ((long)file_ofs < 0) {
    return 0;
  }
  if ((mVar2 != file_ofs) &&
     (iVar1 = fseeko64(*(FILE **)(*(long *)((long)pOpaque + 0x58) + 0x60),file_ofs,0), iVar1 != 0))
  {
    return 0;
  }
  sVar3 = fread(pBuf,1,n,*(FILE **)(*(long *)((long)pOpaque + 0x58) + 0x60));
  return sVar3;
}

Assistant:

static size_t mz_zip_file_read_func(void *pOpaque, mz_uint64 file_ofs,
                                    void *pBuf, size_t n) {
  mz_zip_archive *pZip = (mz_zip_archive *)pOpaque;
  mz_int64 cur_ofs = MZ_FTELL64(pZip->m_pState->m_pFile);
  if (((mz_int64)file_ofs < 0) ||
      (((cur_ofs != (mz_int64)file_ofs)) &&
       (MZ_FSEEK64(pZip->m_pState->m_pFile, (mz_int64)file_ofs, SEEK_SET))))
    return 0;
  return MZ_FREAD(pBuf, 1, n, pZip->m_pState->m_pFile);
}